

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinExport::WriteBinaryLight(AssbinExport *this,IOStream *container,aiLight *l)

{
  uint uVar1;
  AssbinChunkWriter chunk;
  uint32_t t;
  AssbinChunkWriter local_50;
  aiLightSourceType local_14;
  
  local_50.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0082be60;
  local_50.buffer = (uint8_t *)0x0;
  local_50.magic = 0x1235;
  local_50.cur_size = 0;
  local_50.cursor = 0;
  local_50.initial = 0x1000;
  uVar1 = (l->mName).length;
  local_50.container = container;
  AssbinChunkWriter::Grow(&local_50,4);
  *(ai_uint32 *)(local_50.buffer + local_50.cursor) = (l->mName).length;
  local_50.cursor = local_50.cursor + 4;
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,(l->mName).data,(ulong)uVar1,1);
  local_14 = l->mType;
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&local_14,4,1);
  if (l->mType != aiLightSource_DIRECTIONAL) {
    (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&l->mAttenuationConstant,4,1);
    (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&l->mAttenuationLinear,4,1);
    (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&l->mAttenuationQuadratic,4,1);
  }
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&l->mColorDiffuse,4,1);
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&(l->mColorDiffuse).g,4,1);
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&(l->mColorDiffuse).b,4,1);
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&l->mColorSpecular,4,1);
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&(l->mColorSpecular).g,4,1);
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&(l->mColorSpecular).b,4,1);
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&l->mColorAmbient,4,1);
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&(l->mColorAmbient).g,4,1);
  (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&(l->mColorAmbient).b,4,1);
  if (l->mType == aiLightSource_SPOT) {
    (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&l->mAngleInnerCone,4,1);
    (*local_50.super_IOStream._vptr_IOStream[3])(&local_50,&l->mAngleOuterCone,4,1);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_50);
  return;
}

Assistant:

void WriteBinaryLight( IOStream * container, const aiLight* l )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AILIGHT );

        Write<aiString>(&chunk,l->mName);
        Write<unsigned int>(&chunk,l->mType);

        if (l->mType != aiLightSource_DIRECTIONAL) {
            Write<float>(&chunk,l->mAttenuationConstant);
            Write<float>(&chunk,l->mAttenuationLinear);
            Write<float>(&chunk,l->mAttenuationQuadratic);
        }

        Write<aiColor3D>(&chunk,l->mColorDiffuse);
        Write<aiColor3D>(&chunk,l->mColorSpecular);
        Write<aiColor3D>(&chunk,l->mColorAmbient);

        if (l->mType == aiLightSource_SPOT) {
            Write<float>(&chunk,l->mAngleInnerCone);
            Write<float>(&chunk,l->mAngleOuterCone);
        }

    }